

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3LockAndPrepare
              (sqlite3 *db,char *zSql,int nBytes,u32 prepFlags,Vdbe *pOld,sqlite3_stmt **ppStmt,
              char **pzTail)

{
  u8 uVar1;
  Btree *pBVar2;
  sqlite3 *db_00;
  Vdbe *pVVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  TriggerPrg *p;
  long lVar10;
  int *piVar11;
  size_t __n;
  long lVar12;
  bool bVar13;
  char *zErrMsg;
  int cookie;
  TriggerPrg *local_218;
  int local_210;
  u32 local_20c;
  ulong local_208;
  ulong local_200;
  char *local_1f8;
  u64 local_1f0;
  sqlite3_stmt **local_1e8;
  sqlite3 *local_1e0;
  Vdbe *local_1d8;
  Parse local_1d0;
  
  *ppStmt = (sqlite3_stmt *)0x0;
  local_1e8 = ppStmt;
  local_1d8 = pOld;
  iVar6 = sqlite3SafetyCheckOk(db);
  if ((zSql == (char *)0x0) || (iVar6 == 0)) {
    uVar7 = 0x15;
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x1e5eb,
                "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
  }
  else {
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    if (db->noSharedCache == '\0') {
      btreeEnterAll(db);
    }
    bVar4 = (byte)prepFlags;
    bVar5 = bVar4 >> 2 & 1;
    local_200 = (ulong)(uint)nBytes;
    local_1f0 = local_200 + 1;
    local_1f8 = zSql + local_200;
    local_208 = 0;
    local_1e0 = db;
    do {
      do {
        local_218 = (TriggerPrg *)0x0;
        memset(&local_1d0,0,0xcc);
        memset(&local_1d0.sLastToken,0,0xa0);
        local_1d0.pReprepare = local_1d8;
        if ((prepFlags & 1) != 0) {
          local_1d0.disableLookaside = local_1d0.disableLookaside + '\x01';
          (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
        }
        local_1d0.disableVtab = bVar5;
        if (db->nDb < 1) {
          uVar7 = 0;
        }
        else {
          lVar12 = 0;
          lVar10 = 0;
          uVar7 = 0;
          do {
            pBVar2 = *(Btree **)((long)&db->aDb->pBt + lVar12);
            iVar6 = 0;
            if (pBVar2 != (Btree *)0x0) {
              if ((pBVar2->sharable != '\0') &&
                 (pBVar2->wantToLock = pBVar2->wantToLock + 1, pBVar2->locked == '\0')) {
                btreeLockCarefully(pBVar2);
              }
              uVar7 = querySharedCacheTableLock(pBVar2,1,'\x01');
              if (pBVar2->sharable != '\0') {
                piVar11 = &pBVar2->wantToLock;
                *piVar11 = *piVar11 + -1;
                if (*piVar11 == 0) {
                  unlockBtreeMutex(pBVar2);
                }
              }
              if (uVar7 == 0) {
                iVar6 = 0;
                uVar7 = 0;
              }
              else {
                sqlite3ErrorWithMsg(db,uVar7,"database schema is locked: %s",
                                    *(undefined8 *)((long)&db->aDb->zDbSName + lVar12));
                iVar6 = 5;
              }
            }
            if (iVar6 != 0) {
              if (iVar6 != 5) goto LAB_0013c99a;
              goto LAB_0013c992;
            }
            lVar10 = lVar10 + 1;
            lVar12 = lVar12 + 0x20;
          } while (lVar10 < db->nDb);
        }
        sqlite3VtabUnlockList(db);
        local_1d0.db = db;
        if ((nBytes < 0) || ((nBytes != 0 && (zSql[local_200 - 1] == '\0')))) {
          sqlite3RunParser(&local_1d0,zSql,(char **)&local_218);
LAB_0013c6bf:
          db_00 = local_1d0.db;
          if (local_1d0.rc == 0x65) {
            local_1d0.rc = 0;
          }
          if ((local_1d0.checkSchema != '\0') && (db = local_1e0, 0 < (local_1d0.db)->nDb)) {
            lVar10 = 0;
            lVar12 = 0;
            do {
              pBVar2 = *(Btree **)((long)&db_00->aDb->pBt + lVar10);
              if (pBVar2 == (Btree *)0x0) {
                bVar13 = false;
              }
              else {
                uVar1 = pBVar2->inTrans;
                if (((uVar1 != '\0') ||
                    (iVar6 = sqlite3BtreeBeginTrans(pBVar2,0,(int *)0x0), iVar6 == 0)) ||
                   (((bVar13 = true, iVar6 == 0xc0a || (iVar6 == 7)) &&
                    (local_210 = iVar6, sqlite3OomFault(db_00), local_210 == 0)))) {
                  sqlite3BtreeGetMeta(pBVar2,1,&local_20c);
                  if (local_20c != **(u32 **)((long)&db_00->aDb->pSchema + lVar10)) {
                    sqlite3ResetOneSchema(db_00,(int)lVar12);
                    local_1d0.rc = 0x11;
                  }
                  bVar13 = false;
                  if (uVar1 == '\0') {
                    sqlite3BtreeCommit(pBVar2);
                  }
                }
              }
              db = local_1e0;
              if (bVar13) break;
              lVar12 = lVar12 + 1;
              lVar10 = lVar10 + 0x20;
            } while (lVar12 < db_00->nDb);
          }
          if (db->mallocFailed != '\0') {
            local_1d0.rc = 7;
          }
          uVar7 = local_1d0.rc;
          if (pzTail != (char **)0x0) {
            *pzTail = local_1d0.zTail;
          }
          if ((local_1d0.explain != '\0' && local_1d0.pVdbe != (Vdbe *)0x0) && local_1d0.rc == 0) {
            bVar13 = local_1d0.explain == '\x02';
            uVar9 = (ulong)((uint)bVar13 * 8);
            sqlite3VdbeSetNumCols(local_1d0.pVdbe,(uint)!bVar13 * 4 + 4);
            piVar11 = (int *)(sqlite3Prepare_azColName_rel + (ulong)bVar13 * 0x20);
            lVar10 = 0;
            do {
              if ((local_1d0.pVdbe)->db->mallocFailed == '\0') {
                sqlite3VdbeMemSetStr
                          ((Mem *)((long)&(local_1d0.pVdbe)->aColName->u + lVar10),
                           sqlite3Prepare_azColName_rel + *piVar11,-1,'\x01',
                           (_func_void_void_ptr *)0x0);
              }
              uVar9 = uVar9 + 1;
              piVar11 = piVar11 + 1;
              lVar10 = lVar10 + 0x38;
            } while (uVar9 < (ulong)bVar13 * 4 + 8);
          }
          pVVar3 = local_1d0.pVdbe;
          if (((db->init).busy == '\0') && (local_1d0.pVdbe != (Vdbe *)0x0)) {
            (local_1d0.pVdbe)->prepFlags = bVar4;
            if (-1 < (char)bVar4) {
              (local_1d0.pVdbe)->expmask = 0;
            }
            __n = (size_t)((int)local_1d0.zTail - (int)zSql);
            pcVar8 = (char *)sqlite3DbMallocRawNN((local_1d0.pVdbe)->db,__n + 1);
            if (pcVar8 != (char *)0x0) {
              memcpy(pcVar8,zSql,__n);
              pcVar8[__n] = '\0';
            }
            pVVar3->zSql = pcVar8;
          }
          if ((local_1d0.pVdbe == (Vdbe *)0x0) || ((uVar7 == 0 && (db->mallocFailed == '\0')))) {
            *local_1e8 = (sqlite3_stmt *)local_1d0.pVdbe;
          }
          else {
            sqlite3VdbeFinalize(local_1d0.pVdbe);
          }
          p = local_218;
          if (local_218 == (TriggerPrg *)0x0) {
            db->errCode = uVar7;
            if ((uVar7 == 0) && (db->pErr == (sqlite3_value *)0x0)) goto LAB_0013c96f;
            sqlite3ErrorFinish(db,uVar7);
            goto LAB_0013c96f;
          }
          sqlite3ErrorWithMsg(db,uVar7,"%s",local_218);
          while( true ) {
            sqlite3DbFreeNN(db,p);
LAB_0013c96f:
            if (local_1d0.pTriggerPrg == (TriggerPrg *)0x0) break;
            p = local_1d0.pTriggerPrg;
            local_1d0.pTriggerPrg = (local_1d0.pTriggerPrg)->pNext;
          }
LAB_0013c992:
          sqlite3ParserReset(&local_1d0);
        }
        else {
          if (db->aLimit[1] < nBytes) {
            sqlite3ErrorWithMsg(db,0x12,"statement too long");
            if (db->mallocFailed == '\0') {
              uVar7 = db->errMask & 0x12;
            }
            else {
              apiOomError(db);
              uVar7 = 7;
            }
            iVar6 = 5;
          }
          else {
            pcVar8 = (char *)sqlite3DbMallocRawNN(db,local_1f0);
            uVar9 = local_200;
            if (pcVar8 == (char *)0x0) {
              local_1d0.zTail = local_1f8;
            }
            else {
              memcpy(pcVar8,zSql,local_200);
              pcVar8[uVar9] = '\0';
              sqlite3RunParser(&local_1d0,pcVar8,(char **)&local_218);
              local_1d0.zTail = zSql + ((long)local_1d0.zTail - (long)pcVar8);
              sqlite3DbFreeNN(db,pcVar8);
            }
            iVar6 = 0;
          }
          if (iVar6 == 0) goto LAB_0013c6bf;
          if (iVar6 == 5) goto LAB_0013c992;
        }
LAB_0013c99a:
      } while (uVar7 == 0x201);
      if (uVar7 != 0x11) break;
      sqlite3ResetOneSchema(db,-1);
      iVar6 = (int)local_208;
      local_208 = (ulong)(iVar6 + 1);
    } while (iVar6 == 0);
    if (db->noSharedCache == '\0') {
      btreeLeaveAll(db);
    }
    if ((uVar7 == 0xc0a) || (db->mallocFailed != '\0')) {
      apiOomError(db);
      uVar7 = 7;
    }
    else {
      uVar7 = uVar7 & db->errMask;
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return uVar7;
}

Assistant:

static int sqlite3LockAndPrepare(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  Vdbe *pOld,               /* VM being reprepared */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  int rc;
  int cnt = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppStmt==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppStmt = 0;
  if( !sqlite3SafetyCheckOk(db)||zSql==0 ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  do{
    /* Make multiple attempts to compile the SQL, until it either succeeds
    ** or encounters a permanent error.  A schema problem after one schema
    ** reset is considered a permanent error. */
    rc = sqlite3Prepare(db, zSql, nBytes, prepFlags, pOld, ppStmt, pzTail);
    assert( rc==SQLITE_OK || *ppStmt==0 );
  }while( rc==SQLITE_ERROR_RETRY
       || (rc==SQLITE_SCHEMA && (sqlite3ResetOneSchema(db,-1), cnt++)==0) );
  sqlite3BtreeLeaveAll(db);
  rc = sqlite3ApiExit(db, rc);
  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}